

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

char * idToString(PolicyID id)

{
  char *pcStack_10;
  PolicyID id_local;
  
  switch(id) {
  case CMP0000:
    pcStack_10 = "CMP0000";
    break;
  case CMP0001:
    pcStack_10 = "CMP0001";
    break;
  case CMP0002:
    pcStack_10 = "CMP0002";
    break;
  case CMP0003:
    pcStack_10 = "CMP0003";
    break;
  case CMP0004:
    pcStack_10 = "CMP0004";
    break;
  case CMP0005:
    pcStack_10 = "CMP0005";
    break;
  case CMP0006:
    pcStack_10 = "CMP0006";
    break;
  case CMP0007:
    pcStack_10 = "CMP0007";
    break;
  case CMP0008:
    pcStack_10 = "CMP0008";
    break;
  case CMP0009:
    pcStack_10 = "CMP0009";
    break;
  case CMP0010:
    pcStack_10 = "CMP0010";
    break;
  case CMP0011:
    pcStack_10 = "CMP0011";
    break;
  case CMP0012:
    pcStack_10 = "CMP0012";
    break;
  case CMP0013:
    pcStack_10 = "CMP0013";
    break;
  case CMP0014:
    pcStack_10 = "CMP0014";
    break;
  case CMP0015:
    pcStack_10 = "CMP0015";
    break;
  case CMP0016:
    pcStack_10 = "CMP0016";
    break;
  case CMP0017:
    pcStack_10 = "CMP0017";
    break;
  case CMP0018:
    pcStack_10 = "CMP0018";
    break;
  case CMP0019:
    pcStack_10 = "CMP0019";
    break;
  case CMP0020:
    pcStack_10 = "CMP0020";
    break;
  case CMP0021:
    pcStack_10 = "CMP0021";
    break;
  case CMP0022:
    pcStack_10 = "CMP0022";
    break;
  case CMP0023:
    pcStack_10 = "CMP0023";
    break;
  case CMP0024:
    pcStack_10 = "CMP0024";
    break;
  case CMP0025:
    pcStack_10 = "CMP0025";
    break;
  case CMP0026:
    pcStack_10 = "CMP0026";
    break;
  case CMP0027:
    pcStack_10 = "CMP0027";
    break;
  case CMP0028:
    pcStack_10 = "CMP0028";
    break;
  case CMP0029:
    pcStack_10 = "CMP0029";
    break;
  case CMP0030:
    pcStack_10 = "CMP0030";
    break;
  case CMP0031:
    pcStack_10 = "CMP0031";
    break;
  case CMP0032:
    pcStack_10 = "CMP0032";
    break;
  case CMP0033:
    pcStack_10 = "CMP0033";
    break;
  case CMP0034:
    pcStack_10 = "CMP0034";
    break;
  case CMP0035:
    pcStack_10 = "CMP0035";
    break;
  case CMP0036:
    pcStack_10 = "CMP0036";
    break;
  case CMP0037:
    pcStack_10 = "CMP0037";
    break;
  case CMP0038:
    pcStack_10 = "CMP0038";
    break;
  case CMP0039:
    pcStack_10 = "CMP0039";
    break;
  case CMP0040:
    pcStack_10 = "CMP0040";
    break;
  case CMP0041:
    pcStack_10 = "CMP0041";
    break;
  case CMP0042:
    pcStack_10 = "CMP0042";
    break;
  case CMP0043:
    pcStack_10 = "CMP0043";
    break;
  case CMP0044:
    pcStack_10 = "CMP0044";
    break;
  case CMP0045:
    pcStack_10 = "CMP0045";
    break;
  case CMP0046:
    pcStack_10 = "CMP0046";
    break;
  case CMP0047:
    pcStack_10 = "CMP0047";
    break;
  case CMP0048:
    pcStack_10 = "CMP0048";
    break;
  case CMP0049:
    pcStack_10 = "CMP0049";
    break;
  case CMP0050:
    pcStack_10 = "CMP0050";
    break;
  case CMP0051:
    pcStack_10 = "CMP0051";
    break;
  case CMP0052:
    pcStack_10 = "CMP0052";
    break;
  case CMP0053:
    pcStack_10 = "CMP0053";
    break;
  case CMP0054:
    pcStack_10 = "CMP0054";
    break;
  case CMP0055:
    pcStack_10 = "CMP0055";
    break;
  case CMP0056:
    pcStack_10 = "CMP0056";
    break;
  case CMP0057:
    pcStack_10 = "CMP0057";
    break;
  case CMP0058:
    pcStack_10 = "CMP0058";
    break;
  case CMP0059:
    pcStack_10 = "CMP0059";
    break;
  case CMP0060:
    pcStack_10 = "CMP0060";
    break;
  case CMP0061:
    pcStack_10 = "CMP0061";
    break;
  case CMP0062:
    pcStack_10 = "CMP0062";
    break;
  case CMP0063:
    pcStack_10 = "CMP0063";
    break;
  case CMPCOUNT:
    pcStack_10 = (char *)0x0;
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static const char* idToString(cmPolicies::PolicyID id)
{
  switch(id)
    {
#define POLICY_CASE(ID) \
    case cmPolicies::ID: \
      return #ID;
  CM_FOR_EACH_POLICY_ID(POLICY_CASE)
#undef POLICY_CASE
    case cmPolicies::CMPCOUNT:
      return 0;
    }
  return 0;
}